

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_puzzle.cpp
# Opt level: O1

double __thiscall
sliding_puzzle::SlidingPuzzle::getInadmissibleHeuristicCost
          (SlidingPuzzle *this,SlidingPuzzleStatePtr *state,int hidx)

{
  double dVar1;
  double dVar2;
  pointer paVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  
  if (hidx < this->num_inadmissible_heuristic_) {
    paVar3 = (this->heuristic_weight_).
             super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar7 = paVar3[hidx]._M_elems[0];
    iVar4 = calculateManhattanDistance(this,state);
    dVar1 = paVar3[hidx]._M_elems[1];
    iVar5 = calculateLinearConflict(this,state);
    dVar2 = paVar3[hidx]._M_elems[2];
    iVar6 = calculateHammingDistance(this,state);
    dVar7 = (double)iVar6 * dVar2 + (double)iVar5 * dVar1 + (double)iVar4 * dVar7;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Heuristic index out of range...!",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
    dVar7 = -1.0;
  }
  return dVar7;
}

Assistant:

double SlidingPuzzle::getInadmissibleHeuristicCost(const SlidingPuzzleStatePtr &state,
                                                   int hidx)
{
  if (hidx > num_inadmissible_heuristic_-1)
  {
    std::cerr << "Heuristic index out of range...!" << std::endl;
    return -1.0;
  }
  
  return heuristic_weight_[hidx][0]*calculateManhattanDistance(state) +
         heuristic_weight_[hidx][1]*calculateLinearConflict(state) +
         heuristic_weight_[hidx][2]*calculateHammingDistance(state);
}